

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt * __thiscall slang::SVInt::operator++(SVInt *this)

{
  ulong *puVar1;
  ulong uVar2;
  bool bVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  uVar7 = (this->super_SVIntStorage).bitWidth;
  bVar3 = (this->super_SVIntStorage).unknownFlag;
  if (uVar7 < 0x41 && (bVar3 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.pVal =
         (uint64_t *)((this->super_SVIntStorage).field_0.val + 1);
  }
  else if ((bVar3 & 1U) == 0) {
    uVar7 = uVar7 + 0x3f;
    if (0x3f < uVar7) {
      puVar4 = (this->super_SVIntStorage).field_0.pVal;
      uVar9 = 1;
      bVar10 = false;
      lVar8 = 0;
      do {
        puVar1 = puVar4 + lVar8;
        uVar5 = (ulong)bVar10;
        uVar2 = *puVar1;
        uVar6 = *puVar1 + uVar9;
        bVar10 = CARRY8(uVar2,uVar9) || CARRY8(uVar6,uVar5);
        *puVar1 = uVar6 + uVar5;
        if (!CARRY8(uVar2,uVar9) && !CARRY8(uVar6,uVar5)) break;
        uVar9 = 0;
        bVar11 = (ulong)((uVar7 >> 6) << (bVar3 & 0x1fU)) - 1 != lVar8;
        lVar8 = lVar8 + 1;
      } while (bVar11);
    }
  }
  else {
    setAllX(this);
  }
  clearUnusedBits(this);
  return this;
}

Assistant:

SVInt& SVInt::operator++() {
    if (isSingleWord())
        ++val;
    else if (unknownFlag)
        setAllX();
    else
        addOne(pVal, pVal, getNumWords(), 1);
    clearUnusedBits();
    return *this;
}